

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCuesData.cpp
# Opt level: O2

void __thiscall
libmatroska::KaxCueReference::AddReference
          (KaxCueReference *this,KaxBlockBlob *BlockReference,uint64 GlobalTimecodeScale)

{
  KaxInternalBlock *this_00;
  KaxCueRefTime *pKVar1;
  KaxCueRefCluster *pKVar2;
  uint64 uVar3;
  
  this_00 = KaxBlockBlob::operator_cast_to_KaxInternalBlock_(BlockReference);
  pKVar1 = libebml::GetChild<libmatroska::KaxCueRefTime>(&this->super_EbmlMaster);
  (pKVar1->super_EbmlUInteger).Value = this_00->Timecode / GlobalTimecodeScale;
  (pKVar1->super_EbmlUInteger).super_EbmlElement.bValueIsSet = true;
  pKVar2 = libebml::GetChild<libmatroska::KaxCueRefCluster>(&this->super_EbmlMaster);
  uVar3 = KaxInternalBlock::ClusterPosition(this_00);
  (pKVar2->super_EbmlUInteger).Value = uVar3;
  (pKVar2->super_EbmlUInteger).super_EbmlElement.bValueIsSet = true;
  return;
}

Assistant:

void KaxCueReference::AddReference(const KaxBlockBlob & BlockReference, uint64 GlobalTimecodeScale)
{
  const KaxInternalBlock & theBlock = BlockReference;
  KaxCueRefTime & NewTime = GetChild<KaxCueRefTime>(*this);
  *static_cast<EbmlUInteger*>(&NewTime) = theBlock.GlobalTimecode() / GlobalTimecodeScale;

  KaxCueRefCluster & TheClustPos = GetChild<KaxCueRefCluster>(*this);
  *static_cast<EbmlUInteger*>(&TheClustPos) = theBlock.ClusterPosition();

#ifdef OLD
  // handle recursive reference use
  if (BlockReference.ReferenceCount() != 0) {
    unsigned int i;
    for (i=0; i<BlockReference.ReferenceCount(); i++) {
      AddReference(BlockReference.Reference(i).RefBlock());
    }
  }
#endif /* OLD */
}